

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator=
          (RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *this,
          PipelineResourceSignatureGLImpl *pObj)

{
  PipelineResourceSignatureGLImpl *pObj_local;
  RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (PipelineResourceSignatureGLImpl *)0x0) {
      DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
      ::Release((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                 *)this->m_pObject);
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (PipelineResourceSignatureGLImpl *)0x0) {
      RefCountedObject<Diligent::IPipelineResourceSignature>::AddRef
                ((RefCountedObject<Diligent::IPipelineResourceSignature> *)this->m_pObject);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }